

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  xmlAttrPtr cur_00;
  bool bVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr pxVar4;
  int iVar5;
  xmlNodePtr cur_01;
  htmlElemDesc *phVar6;
  char *pcVar7;
  xmlChar *pxVar8;
  _xmlNode *p_Var9;
  
  xmlInitParser();
  if (buf == (xmlOutputBufferPtr)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
  pxVar4 = cur;
  cur_01 = cur->parent;
LAB_0016f75d:
  p_Var9 = cur_01;
  cur_01 = pxVar4;
  switch(cur_01->type) {
  case XML_ELEMENT_NODE:
    if ((cur_01->parent != p_Var9) && (cur_01->children != (_xmlNode *)0x0)) {
      htmlNodeDumpFormatOutput(buf,doc,cur_01,encoding,format);
      goto switchD_0016f77f_caseD_6;
    }
    if (cur_01->ns == (xmlNs *)0x0) {
      phVar6 = htmlTagLookup(cur_01->name);
    }
    else {
      phVar6 = (htmlElemDesc *)0x0;
    }
    xmlOutputBufferWriteString(buf,"<");
    if ((cur_01->ns != (xmlNs *)0x0) && (pxVar8 = cur_01->ns->prefix, pxVar8 != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(buf,(char *)pxVar8);
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    if (cur_01->nsDef != (xmlNsPtr)0x0) {
      xmlNsListDumpOutput(buf,cur_01->nsDef);
    }
    for (cur_00 = cur_01->properties; cur_00 != (xmlAttrPtr)0x0; cur_00 = cur_00->next) {
      htmlAttrDumpOutput(buf,doc,cur_00);
    }
    if (phVar6 == (htmlElemDesc *)0x0) {
      if (cur_01->children != (_xmlNode *)0x0) {
        pcVar7 = ">";
LAB_0016fb0a:
        xmlOutputBufferWriteString(buf,pcVar7);
LAB_0016fb12:
        pxVar4 = cur_01->children;
        goto LAB_0016f75d;
      }
LAB_0016fb55:
      xmlOutputBufferWriteString(buf,"></");
      if ((cur_01->ns != (xmlNs *)0x0) && (pxVar8 = cur_01->ns->prefix, pxVar8 != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf,(char *)pxVar8);
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    }
    else if (phVar6->empty == '\0') {
      if (cur_01->children != (_xmlNode *)0x0) {
        xmlOutputBufferWriteString(buf,">");
        if ((format != 0) && (phVar6->isinline == '\0')) {
          xVar1 = cur_01->children->type;
          if (((xVar1 != XML_TEXT_NODE) &&
              (((xVar1 != XML_ENTITY_REF_NODE && (cur_01->children != cur_01->last)) &&
               (cur_01->name != (xmlChar *)0x0)))) && (pcVar7 = "\n", *cur_01->name != 'p'))
          goto LAB_0016fb0a;
        }
        goto LAB_0016fb12;
      }
      if (((phVar6->saveEndTag == '\0') ||
          (iVar5 = xmlStrcmp((xmlChar *)phVar6->name,"html"), iVar5 == 0)) ||
         (iVar5 = xmlStrcmp((xmlChar *)phVar6->name,"body"), iVar5 == 0)) goto LAB_0016fb55;
    }
    xmlOutputBufferWriteString(buf,">");
    if ((((((format == 0) || (cur_01->next == (_xmlNode *)0x0 || phVar6 == (htmlElemDesc *)0x0)) ||
          (phVar6->isinline != '\0')) ||
         ((xVar1 = cur_01->next->type, xVar1 == XML_TEXT_NODE ||
          (p_Var9 == (xmlNodePtr)0x0 || xVar1 == XML_ENTITY_REF_NODE)))) ||
        (p_Var9->name == (xmlChar *)0x0)) || (*p_Var9->name == 'p')) goto switchD_0016f77f_caseD_6;
LAB_0016fbf3:
    pxVar8 = "\n";
    break;
  case XML_ATTRIBUTE_NODE:
    htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)cur_01);
    goto switchD_0016f77f_caseD_6;
  case XML_TEXT_NODE:
    pxVar8 = cur_01->content;
    if (pxVar8 == (xmlChar *)0x0) goto switchD_0016f77f_caseD_6;
    if (cur_01->name != "textnoenc") {
      if (p_Var9 == (xmlNodePtr)0x0) {
LAB_0016f84f:
        pxVar8 = xmlEncodeEntitiesReentrant(doc,pxVar8);
        if (pxVar8 == (xmlChar *)0x0) {
          buf->error = 2;
          return;
        }
        xmlOutputBufferWriteString(buf,(char *)pxVar8);
        (*xmlFree)(pxVar8);
        goto switchD_0016f77f_caseD_6;
      }
      iVar5 = xmlStrcasecmp(p_Var9->name,"script");
      if (iVar5 == 0) {
        pxVar8 = cur_01->content;
      }
      else {
        iVar5 = xmlStrcasecmp(p_Var9->name,"style");
        pxVar8 = cur_01->content;
        if (iVar5 != 0) goto LAB_0016f84f;
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    pxVar8 = cur_01->content;
    if (pxVar8 == (xmlChar *)0x0) goto switchD_0016f77f_caseD_6;
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWriteString(buf,"&");
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    pxVar8 = ";";
    break;
  default:
    goto switchD_0016f77f_caseD_6;
  case XML_PI_NODE:
    if (cur_01->name == (xmlChar *)0x0) goto switchD_0016f77f_caseD_6;
    xmlOutputBufferWriteString(buf,"<?");
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    if (cur_01->content != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf," ");
      xmlOutputBufferWriteString(buf,(char *)cur_01->content);
    }
    pxVar8 = ">";
    break;
  case XML_COMMENT_NODE:
    if (cur_01->content == (xmlChar *)0x0) goto switchD_0016f77f_caseD_6;
    xmlOutputBufferWriteString(buf,"<!--");
    xmlOutputBufferWriteString(buf,(char *)cur_01->content);
    pxVar8 = "-->";
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar8 = cur_01->content;
    if (pxVar8 != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
      xmlOutputBufferWriteString(buf,*(char **)(pxVar8 + 0x10));
      if (*(long *)(pxVar8 + 0x68) == 0) {
        if ((*(xmlChar **)(pxVar8 + 0x70) != (xmlChar *)0x0) &&
           (iVar5 = xmlStrcmp(*(xmlChar **)(pxVar8 + 0x70),(xmlChar *)"about:legacy-compat"),
           iVar5 != 0)) {
          pcVar7 = " SYSTEM ";
          goto LAB_0016f9c2;
        }
      }
      else {
        xmlOutputBufferWriteString(buf," PUBLIC ");
        xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar8 + 0x68));
        if (*(long *)(pxVar8 + 0x70) != 0) {
          pcVar7 = " ";
LAB_0016f9c2:
          xmlOutputBufferWriteString(buf,pcVar7);
          xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar8 + 0x70));
        }
      }
      xmlOutputBufferWriteString(buf,">\n");
    }
    if (cur_01->children == (_xmlNode *)0x0) goto LAB_0016fbf3;
    pxVar4 = cur_01->children;
    if (cur_01->parent != p_Var9) {
switchD_0016f77f_caseD_6:
      pxVar3 = cur_01;
joined_r0x0016fc05:
      cur_01 = p_Var9;
      if (pxVar3 == cur) {
        return;
      }
      pxVar4 = pxVar3->next;
      if (pxVar3->next == (_xmlNode *)0x0) {
        p_Var9 = cur_01->parent;
        pxVar3 = cur_01;
        if ((cur_01->type | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) goto LAB_0016fc47;
        goto LAB_0016fc2b;
      }
    }
    goto LAB_0016f75d;
  }
  xmlOutputBufferWriteString(buf,(char *)pxVar8);
  goto switchD_0016f77f_caseD_6;
LAB_0016fc47:
  if (((format == 0) || (cur_01->ns != (xmlNs *)0x0)) ||
     (phVar6 = htmlTagLookup(cur_01->name), phVar6 == (htmlElemDesc *)0x0)) {
    bVar2 = false;
    phVar6 = (htmlElemDesc *)0x0;
  }
  else {
    bVar2 = true;
    if (phVar6->isinline == '\0') {
      xVar1 = cur_01->last->type;
      if ((((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
          (cur_01->children != cur_01->last)) &&
         ((cur_01->name != (xmlChar *)0x0 && (*cur_01->name != 'p')))) {
        xmlOutputBufferWriteString(buf,"\n");
      }
    }
  }
  xmlOutputBufferWriteString(buf,"</");
  if ((cur_01->ns != (xmlNs *)0x0) && (pxVar8 = cur_01->ns->prefix, pxVar8 != (xmlChar *)0x0)) {
    xmlOutputBufferWriteString(buf,(char *)pxVar8);
    xmlOutputBufferWriteString(buf,":");
  }
  xmlOutputBufferWriteString(buf,(char *)cur_01->name);
  xmlOutputBufferWriteString(buf,">");
  if ((((bVar2) && (phVar6->isinline == '\0')) && (cur_01->next != (_xmlNode *)0x0)) &&
     (((xVar1 = cur_01->next->type, xVar1 != XML_TEXT_NODE &&
       (p_Var9 != (_xmlNode *)0x0 && xVar1 != XML_ENTITY_REF_NODE)) &&
      ((p_Var9->name != (xmlChar *)0x0 && (*p_Var9->name != 'p')))))) {
LAB_0016fc2b:
    xmlOutputBufferWriteString(buf,"\n");
  }
  goto joined_r0x0016fc05;
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding ATTRIBUTE_UNUSED,
                         int format) {
    xmlNodePtr root, parent;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                /* Always validate cur->parent when descending. */
                if (cur->parent == parent) {
                    parent = cur;
                    cur = cur->children;
                    continue;
                }
            } else {
                xmlOutputBufferWriteString(buf, "\n");
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                htmlNodeDumpFormatOutput(buf, doc, cur, encoding, format);
                break;
            }

            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                parent = cur;
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (parent != NULL) &&
                    (parent->name != NULL) &&
                    (parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((parent == NULL) ||
                 ((xmlStrcasecmp(parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer == NULL) {
                    buf->error = XML_ERR_NO_MEMORY;
                    return;
                }
                xmlOutputBufferWriteString(buf, (const char *)buffer);
                xmlFree(buffer);
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (parent != NULL) &&
                        (parent->name != NULL) &&
                        (parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}